

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  StructDataBitCount SVar4;
  CapTableReader *pCVar5;
  ReadLimiter *pRVar6;
  word *pwVar7;
  Arena *pAVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  ulong uVar12;
  undefined4 extraout_var_00;
  SegmentReader **ppSVar13;
  ElementSize EVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  SegmentBuilder **ppSVar20;
  SegmentBuilder **ppSVar21;
  OrphanBuilder *pOVar22;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  bool bVar23;
  SegmentBuilder *local_68;
  SegmentReader *newSegment;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  local_68 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  ppSVar21 = (SegmentBuilder **)this->location;
  uVar11 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar11 == 0) goto LAB_001835bb;
  pOVar22 = this;
  if ((uVar11 & 3) == 2 && local_68 != (SegmentBuilder *)0x0) {
    iVar10 = (*((local_68->super_SegmentReader).arena)->_vptr_Arena[2])();
    local_68 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 != (SegmentBuilder *)0x0;
    if (local_68 == (SegmentBuilder *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      _kjCondition.left = (SegmentReader **)&local_68;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar11 = (uint)(this->tag).content;
      uVar19 = (ulong)(uVar11 >> 3);
      uVar12 = (local_68->super_SegmentReader).ptr.size_;
      if ((long)uVar12 < (long)uVar19) {
        uVar19 = uVar12;
      }
      uVar15 = 2 - (ulong)((uVar11 & 4) == 0);
      _kjCondition.left = (SegmentReader **)&local_68;
      if (uVar15 + uVar19 <= uVar12) {
        pOVar22 = (OrphanBuilder *)((local_68->super_SegmentReader).ptr.ptr + uVar19);
        pRVar6 = (local_68->super_SegmentReader).readLimiter;
        uVar12 = pRVar6->limit;
        if (uVar15 <= uVar12) {
          pRVar6->limit = uVar12 - uVar15;
          if (((this->tag).content & 4) != 0) {
            pAVar8 = (local_68->super_SegmentReader).arena;
            _kjCondition.left = (SegmentReader **)&local_68;
            iVar10 = (*pAVar8->_vptr_Arena[2])
                               (pAVar8,(ulong)*(uint *)((long)&(pOVar22->tag).content + 4));
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar10);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
            if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00183533:
              ppSVar21 = (SegmentBuilder **)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
            }
            else {
              uVar11 = (uint)(pOVar22->tag).content & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar11);
              _kjCondition.right = " == ";
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar11 == 2);
              if (uVar11 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_00183533;
              }
              uVar12 = (ulong)((uint)(pOVar22->tag).content >> 3);
              sVar9 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
              if ((long)sVar9 < (long)uVar12) {
                uVar12 = sVar9;
              }
              ppSVar21 = (SegmentBuilder **)
                         ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar12);
              local_68 = (SegmentBuilder *)newSegment;
            }
            pOVar22 = (OrphanBuilder *)&pOVar22->segment;
            goto LAB_00183066;
          }
          ppSVar1 = &pOVar22->segment;
          uVar11 = (uint)(pOVar22->tag).content;
          lVar17 = (long)((int)uVar11 >> 2);
          ppSVar20 = ppSVar1 + lVar17;
          if ((local_68 != (SegmentBuilder *)0x0) &&
             ((pwVar7 = (local_68->super_SegmentReader).ptr.ptr,
              ppSVar21 = (SegmentBuilder **)(pwVar7 + (local_68->super_SegmentReader).ptr.size_),
              lVar17 < (long)pwVar7 - (long)ppSVar1 >> 3 ||
              ((long)ppSVar21 - (long)ppSVar1 >> 3 < lVar17)))) goto LAB_00183066;
          goto LAB_00183073;
        }
        _kjCondition.left = (SegmentReader **)&local_68;
        (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  else {
LAB_00183066:
    if (ppSVar21 == (SegmentBuilder **)0x0) goto LAB_001835bb;
    uVar11 = (uint)(pOVar22->tag).content;
    ppSVar20 = ppSVar21;
LAB_00183073:
    uVar11 = uVar11 & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar11);
    _kjCondition.right = " == ";
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar11 == 1);
    if (uVar11 == 1) {
      uVar11 = *(uint *)((long)&(pOVar22->tag).content + 4);
      EVar14 = (ElementSize)uVar11 & INLINE_COMPOSITE;
      if (EVar14 == INLINE_COMPOSITE) {
        f_2.exception._0_4_ = uVar11 >> 3;
        if (local_68 == (SegmentBuilder *)0x0) {
LAB_00183358:
          bVar23 = (*(uint *)ppSVar20 & 3) == 0;
          _kjCondition.left = (SegmentReader **)((ulong)*(uint *)ppSVar20 & 0xffffffff00000003);
          _kjCondition.right = " == ";
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar23);
          if (bVar23) {
            uVar11 = *(uint *)ppSVar20 >> 2 & 0x1fffffff;
            uVar12 = (ulong)uVar11;
            uVar16 = (uint)*(ushort *)((long)ppSVar20 + 6) + (uint)*(ushort *)((long)ppSVar20 + 4);
            _kjCondition.left = (SegmentReader **)(uVar16 * uVar12);
            _kjCondition.right = &f_2;
            _kjCondition.op.content.ptr = " <= ";
            ppSVar13 = (SegmentReader **)(ulong)(uint)f_2.exception;
            _kjCondition.op.content.size_ = 5;
            bVar23 = (long)_kjCondition.left - (long)ppSVar13 == 0;
            _kjCondition.result = _kjCondition.left < ppSVar13 || bVar23;
            if (_kjCondition.left < ppSVar13 || bVar23) {
              if (uVar16 == 0) {
                if (local_68 == (SegmentBuilder *)0x0) {
                  local_68 = (SegmentBuilder *)0x0;
                }
                else {
                  pRVar6 = (local_68->super_SegmentReader).readLimiter;
                  uVar19 = pRVar6->limit;
                  if (uVar19 < uVar12) {
                    (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
                    pcVar18 = "amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))";
                    iVar10 = 0x917;
                    goto LAB_00183679;
                  }
                  pRVar6->limit = uVar19 - uVar12;
                }
              }
              uVar2 = *(ushort *)((long)ppSVar20 + 4);
              SVar3 = *(StructPointerCount *)((long)ppSVar20 + 6);
              __return_storage_ptr__->segment = &local_68->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar5;
              __return_storage_ptr__->ptr = (byte *)(ppSVar20 + 1);
              __return_storage_ptr__->elementCount = uVar11;
              __return_storage_ptr__->step = uVar16 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = SVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
              goto LAB_00183618;
            }
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                       "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                       (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                       (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
          }
          else {
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
          }
          goto LAB_001835b1;
        }
        if (((long)ppSVar20 - (long)(local_68->super_SegmentReader).ptr.ptr >> 3) +
            (ulong)(uint)f_2.exception + 1 <= (local_68->super_SegmentReader).ptr.size_) {
          uVar12 = (ulong)(uint)f_2.exception + 1;
          pRVar6 = (local_68->super_SegmentReader).readLimiter;
          uVar19 = pRVar6->limit;
          if (uVar12 <= uVar19) {
            pRVar6->limit = uVar19 - uVar12;
            goto LAB_00183358;
          }
          (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        pcVar18 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
        iVar10 = 0x900;
      }
      else {
        SVar4 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar11 & 7) * 4);
        uVar12 = (ulong)(uVar11 >> 3);
        uVar16 = (uint)(EVar14 == POINTER) * 0x40 + SVar4;
        if (local_68 == (SegmentBuilder *)0x0) {
LAB_001833d4:
          if (EVar14 == BIT) {
            this_00 = &_kjCondition;
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x969,FAILED,(char *)0x0,
                       "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                       ,(char (*) [106])0x1edb3d);
            goto LAB_001835b1;
          }
          if (((int)((ulong)uVar11 & 7) == 0) && (local_68 != (SegmentBuilder *)0x0)) {
            pRVar6 = (local_68->super_SegmentReader).readLimiter;
            uVar19 = pRVar6->limit;
            if (uVar19 < uVar12) {
              (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
              pcVar18 = "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))";
              iVar10 = 0x960;
LAB_00183679:
              newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
              this_00 = &_kjCondition;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,iVar10,FAILED,pcVar18,
                         "_kjCondition,\"Message contains amplified list pointer.\"",
                         (DebugExpression<bool> *)&newSegment,
                         (char (*) [41])"Message contains amplified list pointer.");
              goto LAB_001835b1;
            }
            pRVar6->limit = uVar19 - uVar12;
          }
          __return_storage_ptr__->segment = &local_68->super_SegmentReader;
          __return_storage_ptr__->capTable = pCVar5;
          __return_storage_ptr__->ptr = (byte *)ppSVar20;
          __return_storage_ptr__->elementCount = uVar11 >> 3;
          __return_storage_ptr__->step = uVar16;
          __return_storage_ptr__->structDataSize = SVar4;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar14 == POINTER);
          __return_storage_ptr__->elementSize = EVar14;
LAB_00183618:
          __return_storage_ptr__->nestingLimit = 0x7ffffffe;
          return __return_storage_ptr__;
        }
        uVar19 = uVar16 * uVar12 + 0x3f >> 6 & 0xffffffff;
        if (((long)ppSVar20 - (long)(local_68->super_SegmentReader).ptr.ptr >> 3) + uVar19 <=
            (local_68->super_SegmentReader).ptr.size_) {
          pRVar6 = (local_68->super_SegmentReader).readLimiter;
          uVar15 = pRVar6->limit;
          if (uVar19 <= uVar15) {
            pRVar6->limit = uVar15 - uVar19;
            goto LAB_001833d4;
          }
          (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        pcVar18 = "boundsCheck(segment, ptr, wordCount)";
        iVar10 = 0x958;
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,iVar10,FAILED,pcVar18,
                 "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [319])
                 "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [84])
                 "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                );
    }
  }
LAB_001835b1:
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
LAB_001835bb:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}